

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicsscene.cpp
# Opt level: O0

int __thiscall QGraphicsScene::qt_metacall(QGraphicsScene *this,Call _c,int _id,void **_a)

{
  uint in_EDX;
  int in_ESI;
  Call in_EDI;
  void **in_stack_00000070;
  int in_stack_00000078;
  Call in_stack_0000007c;
  QObject *in_stack_00000080;
  undefined4 local_18;
  undefined4 local_4;
  
  local_18 = QObject::qt_metacall(in_EDI,in_ESI,(void **)(ulong)in_EDX);
  local_4 = local_18;
  if (-1 < local_18) {
    if (in_ESI == 0) {
      if (local_18 < 0x11) {
        qt_static_metacall(in_stack_00000080,in_stack_0000007c,in_stack_00000078,in_stack_00000070);
      }
      local_18 = local_18 + -0x11;
    }
    if (in_ESI == 7) {
      if (local_18 < 0x11) {
        qt_static_metacall(in_stack_00000080,in_stack_0000007c,in_stack_00000078,in_stack_00000070);
      }
      local_18 = local_18 + -0x11;
    }
    if ((((in_ESI == 1) || (in_ESI == 2)) || (in_ESI == 3)) || ((in_ESI == 8 || (in_ESI == 6)))) {
      qt_static_metacall(in_stack_00000080,in_stack_0000007c,in_stack_00000078,in_stack_00000070);
      local_18 = local_18 + -10;
    }
    local_4 = local_18;
  }
  return local_4;
}

Assistant:

int QGraphicsScene::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QObject::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 17)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 17;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 17)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 17;
    }
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 10;
    }
    return _id;
}